

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O1

void __thiscall CGL::ImageBuffer::update_pixel(ImageBuffer *this,Color *c,size_t x,size_t y)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  if (*(ulong *)this <= x) {
    __assert_fail("0 <= x && x < w",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/util/image.h"
                  ,0x36,"void CGL::ImageBuffer::update_pixel(const Color &, size_t, size_t)");
  }
  if (y < *(ulong *)(this + 8)) {
    uVar1 = c->g;
    uVar2 = c->b;
    auVar3._4_4_ = uVar2;
    auVar3._0_4_ = uVar1;
    auVar3._8_8_ = 0;
    auVar7._8_4_ = 0x3f800000;
    auVar7._0_8_ = 0x3f8000003f800000;
    auVar7._12_4_ = 0x3f800000;
    auVar3 = vminps_avx(auVar3,auVar7);
    auVar4._0_4_ = auVar3._0_4_ * 255.0;
    auVar4._4_4_ = auVar3._4_4_ * 255.0;
    auVar4._8_4_ = auVar3._8_4_ * 255.0;
    auVar4._12_4_ = auVar3._12_4_ * 255.0;
    auVar6._0_4_ = (int)auVar4._0_4_;
    auVar6._4_4_ = (int)auVar4._4_4_;
    auVar6._8_4_ = (int)auVar4._8_4_;
    auVar6._12_4_ = (int)auVar4._12_4_;
    auVar7 = vpsrad_avx(auVar6,0x1f);
    auVar8._8_4_ = 0x4f000000;
    auVar8._0_8_ = 0x4f0000004f000000;
    auVar8._12_4_ = 0x4f000000;
    auVar3 = vsubps_avx(auVar4,auVar8);
    auVar5._0_4_ = (int)auVar3._0_4_;
    auVar5._4_4_ = (int)auVar3._4_4_;
    auVar5._8_4_ = (int)auVar3._8_4_;
    auVar5._12_4_ = (int)auVar3._12_4_;
    auVar3 = vpand_avx(auVar5,auVar7);
    auVar3 = vpor_avx(auVar6,auVar3);
    auVar5 = vpsllvd_avx2(auVar3,_DAT_001156f0);
    auVar3 = vminss_avx(ZEXT416((uint)c->r),ZEXT416(0x3f800000));
    auVar4 = vpshufd_avx(auVar5,0x55);
    auVar4 = vpor_avx(auVar4,auVar5);
    *(uint *)(*(ulong *)this * y * 4 + *(long *)(this + 0x10) + x * 4) =
         auVar4._0_4_ | (uint)(long)(auVar3._0_4_ * 255.0) | 0xff000000;
    return;
  }
  __assert_fail("0 <= y && y < h",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/util/image.h"
                ,0x37,"void CGL::ImageBuffer::update_pixel(const Color &, size_t, size_t)");
}

Assistant:

void update_pixel(const Color& c, size_t x, size_t y) {
    assert(0 <= x && x < w);
    assert(0 <= y && y < h);
    uint32_t p = 0;
    p |= ((uint32_t) (clamp(0.f, 1.f, c.b) * 255)) << 16;
    p |= ((uint32_t) (clamp(0.f, 1.f, c.g) * 255)) << 8;
    p |= ((uint32_t) (clamp(0.f, 1.f, c.r) * 255));
    p |= 0xFF000000;
    data[x + y * w] = p;
  }